

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall
chrono::ChFile_ps::DrawLine
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mto,Space space)

{
  ChStreamOutAscii *this_00;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_48;
  ChVector2<double> local_38;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  ChStreamOutAscii::operator<<(this_00,"NP\n");
  local_48.m_data[0] = mfrom->m_data[0];
  local_48.m_data[1] = mfrom->m_data[1];
  TransPt(this,&local_48,space);
  MoveTo(this,&local_38);
  local_68.m_data[0] = mto->m_data[0];
  local_68.m_data[1] = mto->m_data[1];
  TransPt(this,&local_68,space);
  AddLinePoint(this,&local_58);
  ChStreamOutAscii::operator<<(this_00,"SK\n");
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawLine(ChVector2<> mfrom, ChVector2<> mto, Space space) {
    GrSave();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mto, space));
    PaintStroke();
    GrRestore();
}